

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_busy_handler(sqlite3 *db,_func_int_void_ptr_int *xBusy,void *pArg)

{
  void *pArg_local;
  _func_int_void_ptr_int *xBusy_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  (db->busyHandler).xBusyHandler = xBusy;
  (db->busyHandler).pBusyArg = pArg;
  (db->busyHandler).nBusy = 0;
  db->busyTimeout = 0;
  sqlite3_mutex_leave(db->mutex);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_busy_handler(
  sqlite3 *db,
  int (*xBusy)(void*,int),
  void *pArg
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->busyHandler.xBusyHandler = xBusy;
  db->busyHandler.pBusyArg = pArg;
  db->busyHandler.nBusy = 0;
  db->busyTimeout = 0;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}